

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall
InvertedLattice_Meet_Test::~InvertedLattice_Meet_Test(InvertedLattice_Meet_Test *this)

{
  InvertedLattice_Meet_Test *this_local;
  
  ~InvertedLattice_Meet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(InvertedLattice, Meet) {
  analysis::Inverted inverted(analysis::Bool{});
  bool elem = false;

  EXPECT_FALSE(inverted.meet(elem, false));
  ASSERT_FALSE(elem);

  EXPECT_TRUE(inverted.meet(elem, true));
  ASSERT_TRUE(elem);

  EXPECT_FALSE(inverted.meet(elem, false));
  ASSERT_TRUE(elem);

  EXPECT_FALSE(inverted.meet(elem, true));
  ASSERT_TRUE(elem);
}